

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_extended_filtration_unit_test.cpp
# Opt level: O0

void simplex_tree_extend_same_filtration_invoker::run<Gudhi::Simplex_tree<Low_options>>
               (type<Gudhi::Simplex_tree<Low_options>_> *param_1)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8d9;
  basic_wrap_stringstream<char> local_8d8;
  basic_cstring<const_char> local_740;
  basic_cstring<const_char> local_730;
  char local_719;
  basic_wrap_stringstream<char> local_718;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  char local_559;
  basic_wrap_stringstream<char> local_558;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  char local_399;
  basic_wrap_stringstream<char> local_398;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  simplex_tree_extend_same_filtration<Gudhi::Simplex_tree<Low_options>_> local_1dd [8];
  simplex_tree_extend_same_filtration<Gudhi::Simplex_tree<Low_options>_> t;
  char local_1c9;
  basic_wrap_stringstream<char> local_1c8;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  type<Gudhi::Simplex_tree<Low_options>_> *local_10;
  type<Gudhi::Simplex_tree<Low_options>_> *param_0_local;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_10 = param_1;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
             ,0x8a);
  memset(&local_1c8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c8);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c8);
  local_1c9 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_1c9);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [36])"simplex_tree_extend_same_filtration");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0xaa,&local_30);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
             ,0x8a);
  memset(&local_398,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_398);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_398);
  local_399 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_399);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [36])"simplex_tree_extend_same_filtration");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_200,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f0,0xaa,&local_200);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_398);
  boost::unit_test::
  setup_conditional<simplex_tree_extend_same_filtration<Gudhi::Simplex_tree<Low_options>>>
            (local_1dd);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3b0,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
             ,0x8a);
  memset(&local_558,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_558);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_558);
  local_559 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_559);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [36])"simplex_tree_extend_same_filtration");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0xaa,&local_3c0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_558);
  simplex_tree_extend_same_filtration<Gudhi::Simplex_tree<Low_options>_>::test_method(local_1dd);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_570,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
             ,0x8a);
  memset(&local_718,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_718);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_718);
  local_719 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_719);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [36])"simplex_tree_extend_same_filtration");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_580,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_570,0xaa,&local_580);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_718);
  boost::unit_test::
  teardown_conditional<simplex_tree_extend_same_filtration<Gudhi::Simplex_tree<Low_options>>>
            (local_1dd);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_730,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
             ,0x8a);
  memset(&local_8d8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8d8);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8d8);
  local_8d9 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8d9);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [36])"simplex_tree_extend_same_filtration");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_740,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_730,0xaa,&local_740);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8d8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_extend_same_filtration, Stree, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "BASIC SIMPLEX TREE EXTEND WITH THE SAME FILTRATION LIMIT CASE" << std::endl;
  Stree st;
  
  // some vertices with the same filtration values
  st.insert_simplex({0}, 1.0);
  st.insert_simplex({1}, 1.0);
  st.insert_simplex({2}, 1.0);
  st.insert_simplex({3}, 1.0);
  st.insert_simplex({4}, 1.0);
  st.insert_simplex({5}, 1.0);
  Stree copy(st);

  auto efd = st.extend_filtration();

  using Filtration_value = typename Stree::Filtration_value;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0})), Filtration_value(-2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({1})), Filtration_value(-2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({2})), Filtration_value(-2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3})), Filtration_value(-2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({4})), Filtration_value(-2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({5})), Filtration_value(-2.0));
  // Check additional point for coning the simplicial complex
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({6})), Filtration_value(-3.0));

  GUDHI_TEST_FLOAT_EQUALITY_CHECK(efd.minval, Filtration_value(1.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(efd.maxval, Filtration_value(1.0));

  Filtration_value epsilon = 2 * std::numeric_limits<Filtration_value>::epsilon();
  Filtration_value filt;
  Gudhi::Extended_simplex_type est = Gudhi::Extended_simplex_type::EXTRA;
  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({0})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({0})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({1})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({1})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({2})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({2})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({3})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({3})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({4})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({4})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({5})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({5})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  BOOST_CHECK(std::isnan(filt));
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::EXTRA);

  // Test to the limit - Intervals are [-2., -1.] and [1., 2.]
  std::tie(filt, est) = st.decode_extended_filtration(Filtration_value(-0.9), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  BOOST_CHECK(std::isnan(filt));
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::EXTRA);

  std::tie(filt, est) = st.decode_extended_filtration(Filtration_value(0.9), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  BOOST_CHECK(std::isnan(filt));
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::EXTRA);
}